

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O0

int If_LogCounterPinDelays
              (int *pTimes,int *pnTimes,word *pPinDels,int Num,word PinDel,int nSuppAll,int fXor)

{
  int iVar1;
  word wVar2;
  int local_58;
  word t_1;
  int local_40;
  int t;
  int k;
  int i;
  int nTimes;
  int nSuppAll_local;
  word PinDel_local;
  int Num_local;
  word *pPinDels_local;
  int *pnTimes_local;
  int *pTimes_local;
  
  local_40 = *pnTimes;
  pPinDels[local_40] = PinDel;
  k = local_40 + 1;
  pTimes[local_40] = Num;
  if (1 < k) {
    for (; (0 < local_40 && (pTimes[local_40 + -1] <= pTimes[local_40])); local_40 = local_40 + -1)
    {
      if (pTimes[local_40 + -1] < pTimes[local_40]) {
        iVar1 = pTimes[local_40];
        pTimes[local_40] = pTimes[local_40 + -1];
        pTimes[local_40 + -1] = iVar1;
        wVar2 = pPinDels[local_40];
        pPinDels[local_40] = pPinDels[local_40 + -1];
        pPinDels[local_40 + -1] = wVar2;
      }
      else {
        pTimes[local_40 + -1] = fXor + 1 + pTimes[local_40 + -1];
        wVar2 = If_CutPinDelayMax(pPinDels[local_40],pPinDels[local_40 + -1],nSuppAll,fXor + 1);
        pPinDels[local_40 + -1] = wVar2;
        k = k + -1;
        for (t = local_40; t < k; t = t + 1) {
          pTimes[t] = pTimes[t + 1];
          pPinDels[t] = pPinDels[t + 1];
        }
      }
    }
  }
  if (k < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                  ,0xe2,"int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)");
  }
  *pnTimes = k;
  if (k < 2) {
    local_58 = 0;
  }
  else {
    local_58 = fXor + 1;
  }
  return *pTimes + local_58;
}

Assistant:

static inline int If_LogCounterPinDelays( int * pTimes, int * pnTimes, word * pPinDels, int Num, word PinDel, int nSuppAll, int fXor )
{
    int nTimes = *pnTimes;
    pPinDels[nTimes] = PinDel;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                ABC_SWAP( word, pPinDels[k], pPinDels[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            pPinDels[k-1] = If_CutPinDelayMax( pPinDels[k], pPinDels[k-1], nSuppAll, 1 + fXor );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                pPinDels[i] = pPinDels[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}